

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O2

Roaring64Map *
doublechecked::Roaring64Map::fastunion
          (Roaring64Map *__return_storage_ptr__,size_t n,Roaring64Map **inputs)

{
  bool bVar1;
  Roaring64Map **inputs_00;
  uint64_t uVar2;
  size_t i;
  size_t sVar3;
  Roaring64Map temp;
  
  inputs_00 = (Roaring64Map **)operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
  for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
    inputs_00[sVar3] = &inputs[sVar3]->plain;
  }
  roaring::Roaring64Map::fastunion(&temp.plain,n,inputs_00);
  Roaring64Map(__return_storage_ptr__,&temp.plain);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&temp);
  operator_delete__(inputs_00);
  if (n == 0) {
    uVar2 = cardinality(__return_storage_ptr__);
    _assert_true((ulong)(uVar2 == 0),"ans.cardinality() == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
                 ,0x1fe);
  }
  else {
    Roaring64Map(&temp,*inputs);
    for (sVar3 = 1; n != sVar3; sVar3 = sVar3 + 1) {
      operator|=(&temp,inputs[sVar3]);
    }
    bVar1 = operator==(&temp,__return_storage_ptr__);
    _assert_true((ulong)bVar1,"temp == ans",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
                 ,0x202);
    ~Roaring64Map(&temp);
  }
  return __return_storage_ptr__;
}

Assistant:

static Roaring64Map fastunion(size_t n, const Roaring64Map **inputs) {
        auto plain_inputs = new const roaring::Roaring64Map *[n];
        for (size_t i = 0; i < n; ++i) plain_inputs[i] = &inputs[i]->plain;
        Roaring64Map ans(roaring::Roaring64Map::fastunion(n, plain_inputs));
        delete[] plain_inputs;

        if (n == 0)
            assert_true(ans.cardinality() == 0);
        else {
            Roaring64Map temp = *inputs[0];
            for (size_t i = 1; i < n; ++i) temp |= *inputs[i];
            assert_true(temp == ans);
        }

        return ans;
    }